

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GamepadInputHandler_glfw.cpp
# Opt level: O0

int __thiscall
GamepadInputHandler::poll(GamepadInputHandler *this,pollfd *__fds,nfds_t __nfds,int __timeout)

{
  GamepadState __args;
  bool bVar1;
  int iVar2;
  int extraout_EAX;
  undefined7 extraout_var;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined1 local_60 [8];
  GamepadState glexState;
  GLFWgamepadstate glfwState;
  GamepadInputHandler *this_local;
  
  iVar2 = glfwGetGamepadState((uint)this->_gamepadIndex,(GLFWgamepadstate *)(glexState.analog + 4));
  if (iVar2 != 0) {
    GamepadState::GamepadState((GamepadState *)local_60);
    local_60._0_4_ = glexState.analog[4];
    local_60._4_4_ = glexState.analog[5];
    glexState._12_4_ = glfwState._12_4_ ^ 0x80000000;
    glexState.analog[1] = -glfwState.axes[1];
    glexState.analog[2] = (glfwState.axes[2] + 1.0) / 2.0;
    glexState.analog[3] = (glfwState.axes[3] + 1.0) / 2.0;
    memcpy(&this->_currentState,local_60,0x28);
    bVar1 = std::function::operator_cast_to_bool((function *)&this->_rawCallback);
    iVar2 = (int)CONCAT71(extraout_var,bVar1);
    if (bVar1) {
      memcpy(&local_88,&this->_currentState,0x28);
      __args.buttons[8] = (undefined1)uStack_80;
      __args.buttons[9] = uStack_80._1_1_;
      __args.buttons[10] = uStack_80._2_1_;
      __args.buttons[0xb] = uStack_80._3_1_;
      __args.buttons[0xc] = uStack_80._4_1_;
      __args.buttons[0xd] = uStack_80._5_1_;
      __args.buttons[0xe] = uStack_80._6_1_;
      __args._15_1_ = uStack_80._7_1_;
      __args.buttons[0] = (undefined1)local_88;
      __args.buttons[1] = local_88._1_1_;
      __args.buttons[2] = local_88._2_1_;
      __args.buttons[3] = local_88._3_1_;
      __args.buttons[4] = local_88._4_1_;
      __args.buttons[5] = local_88._5_1_;
      __args.buttons[6] = local_88._6_1_;
      __args.buttons[7] = local_88._7_1_;
      __args.analog[0] = (float)(undefined4)local_78;
      __args.analog[1] = (float)local_78._4_4_;
      __args.analog[2] = (float)(undefined4)uStack_70;
      __args.analog[3] = (float)uStack_70._4_4_;
      __args.analog[4] = (float)(undefined4)local_68;
      __args.analog[5] = (float)local_68._4_4_;
      std::function<void_(GamepadState)>::operator()(&this->_rawCallback,__args);
      iVar2 = extraout_EAX;
    }
  }
  return iVar2;
}

Assistant:

void GamepadInputHandler::poll() {
    // Get the GLFW gamepad state
    GLFWgamepadstate glfwState;
    if (glfwGetGamepadState(_gamepadIndex, &glfwState)) {
        // Convert to GLEX state format
        GamepadState glexState;
        std::memcpy(glexState.buttons, glfwState.buttons, sizeof(unsigned char) * (GamepadButton::LAST + 1));

        glexState.analog[GamepadAnalog::L_STICK_X] = glfwState.axes[GamepadAnalog::L_STICK_X];
        glexState.analog[GamepadAnalog::R_STICK_X] = glfwState.axes[GamepadAnalog::R_STICK_X];

        // Invert L and R sticks Y-axis so that up is positive
        glexState.analog[GamepadAnalog::L_STICK_Y] = -(glfwState.axes[GamepadAnalog::L_STICK_Y]);
        glexState.analog[GamepadAnalog::R_STICK_Y] = -(glfwState.axes[GamepadAnalog::R_STICK_Y]);
        
        // Convert L and R triggers to 0.0 - 1.0 range
        glexState.analog[GamepadAnalog::L_TRIGGER] = (glfwState.axes[GamepadAnalog::L_TRIGGER] + 1.0) / 2.0;
        glexState.analog[GamepadAnalog::R_TRIGGER] = (glfwState.axes[GamepadAnalog::R_TRIGGER] + 1.0) / 2.0;

        _currentState = glexState;

        // Call the raw state callback if it exists
        if (_rawCallback) {
            _rawCallback(_currentState);
        }
    }
}